

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

int __thiscall
QCache<QString,_QRegularExpression>::unlink(QCache<QString,_QRegularExpression> *this,char *__name)

{
  long lVar1;
  long in_FS_OFFSET;
  Bucket it;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(*(long *)__name + 8) = *(undefined8 *)(__name + 8);
  **(undefined8 **)(__name + 8) = *(undefined8 *)__name;
  this->total = this->total - *(long *)(__name + 0x30);
  QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::findBucket<QString>
            ((Data<QCache<QString,_QRegularExpression>::Node> *)this,(QString *)__name);
  QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::erase
            ((Data<QCache<QString,_QRegularExpression>::Node> *)__name,it);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void unlink(Node *n) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        Q_ASSERT(n->prev);
        Q_ASSERT(n->next);
        n->prev->next = n->next;
        n->next->prev = n->prev;
        total -= n->value.cost;
        auto it = d.findBucket(n->key);
        d.erase(it);
    }